

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::mouseMoveEvent(QListView *this,QMouseEvent *e)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  QRect QVar1;
  QRect QVar2;
  State SVar3;
  int iVar4;
  int iVar5;
  QStyle *pQVar6;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  QRect local_58;
  QRect local_48;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)->
       widget_attributes & 0x8000) != 0) {
    this_00 = *(QListViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemView::mouseMoveEvent((QAbstractItemView *)this,e);
    SVar3 = QAbstractItemView::state((QAbstractItemView *)this);
    QVar2.x2.m_i = local_38.x2.m_i;
    QVar2.y2.m_i = local_38.y2.m_i;
    QVar2.x1.m_i = local_38.x1.m_i;
    QVar2.y1.m_i = local_38.y1.m_i;
    QVar1.x2.m_i = local_38.x2.m_i;
    QVar1.y2.m_i = local_38.y2.m_i;
    QVar1.x1.m_i = local_38.x1.m_i;
    QVar1.y1.m_i = local_38.y1.m_i;
    if (((SVar3 == DragSelectingState) && (local_38 = QVar1, this_00->showElasticBand == true)) &&
       (local_38 = QVar2, SingleSelection < (this_00->super_QAbstractItemViewPrivate).selectionMode)
       ) {
      auVar9 = QEventPoint::position();
      uVar10 = extraout_XMM1_Qb;
      uVar11 = extraout_XMM0_Qb;
      iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b0))(this);
      iVar5 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b8))(this);
      auVar8._0_8_ = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar9._0_8_;
      auVar8._8_8_ = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar9._8_8_;
      auVar7 = maxpd(auVar8,_DAT_006605e0);
      local_38._0_8_ = (this_00->super_QAbstractItemViewPrivate).pressedPosition;
      local_38.x2.m_i =
           iVar4 + (int)(double)(~-(ulong)(2147483647.0 < auVar8._0_8_) & auVar7._0_8_ |
                                -(ulong)(2147483647.0 < auVar8._0_8_) & 0x41dfffffffc00000);
      local_38.y2.m_i =
           iVar5 + (int)(double)(~-(ulong)(2147483647.0 < auVar8._8_8_) & auVar7._8_8_ |
                                -(ulong)(2147483647.0 < auVar8._8_8_) & 0x41dfffffffc00000);
      local_38 = (QRect)QRect::normalized();
      pQVar6 = QWidget::style((QWidget *)this);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))
                        (pQVar6,5,0,0,*(long *)pQVar6,in_R9,auVar9._8_8_,uVar10,auVar9._0_8_,uVar11)
      ;
      auVar8 = QRect::operator|(&local_38,&this_00->elasticBand);
      local_48.x1.m_i = auVar8._0_4_ + iVar4 * -2;
      local_48.x2.m_i = auVar8._8_4_ + iVar4 * 2;
      local_48.y1.m_i = auVar8._4_4_ + iVar4 * -2;
      local_48.y2.m_i = auVar8._12_4_ + iVar4 * 2;
      this_01 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
      local_58 = QListViewPrivate::mapToViewport(this_00,&local_48,true);
      QWidget::update(this_01,&local_58);
      this_00->elasticBand = local_38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::mouseMoveEvent(QMouseEvent *e)
{
    if (!isVisible())
        return;
    Q_D(QListView);
    QAbstractItemView::mouseMoveEvent(e);
    if (state() == DragSelectingState
        && d->showElasticBand
        && d->selectionMode != SingleSelection
        && d->selectionMode != NoSelection) {
        QRect rect(d->pressedPosition, e->position().toPoint() + QPoint(horizontalOffset(), verticalOffset()));
        rect = rect.normalized();
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = rect.united(d->elasticBand)
                                       .adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = rect;
    }
}